

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O0

void flash(void)

{
  ubyte local_a;
  byte local_9;
  ubyte d;
  ubyte c;
  
  for (local_9 = 0; local_9 < 0x10; local_9 = local_9 + 1) {
    if ((vidpal[local_9] & 8) != 0) {
      if ((vid_con_reg & 1) == 0) {
        switch(~vidpal[local_9] & 7) {
        case 0:
          local_a = '\a';
          break;
        case 1:
          local_a = '\x06';
          break;
        case 2:
          local_a = '\x05';
          break;
        case 3:
          local_a = '\x04';
          break;
        case 4:
          local_a = '\x03';
          break;
        case 5:
          local_a = '\x02';
          break;
        case 6:
          local_a = '\x01';
          break;
        case 7:
          local_a = '\0';
        }
        setpalette(local_9,local_a);
      }
      else {
        switch(~vidpal[local_9] & 7) {
        case 0:
          local_a = '\0';
          break;
        case 1:
          local_a = '\x01';
          break;
        case 2:
          local_a = '\x02';
          break;
        case 3:
          local_a = '\x03';
          break;
        case 4:
          local_a = '\x04';
          break;
        case 5:
          local_a = '\x05';
          break;
        case 6:
          local_a = '\x06';
          break;
        case 7:
          local_a = '\a';
        }
        setpalette(local_9,local_a);
      }
    }
  }
  return;
}

Assistant:

void flash(void) {  // flash function, alternates the flash colours
    ubyte c;         // depending on the video ULA control register
    ubyte d;

    for (c = 0; c < 16; c++)         // loop through each logical colour
        if (vidpal[c] & 8) {
            if (vid_con_reg & 1) {
                switch ((vidpal[c] & 7) ^ 7) {
                    case 0:
                        d = EGA_WHITE;
                        break;
                    case 1:
                        d = EGA_CYAN;
                        break;
                    case 2:
                        d = EGA_MAGENTA;
                        break;
                    case 3:
                        d = EGA_BLUE;
                        break;
                    case 4:
                        d = EGA_YELLOW;
                        break;
                    case 5:
                        d = EGA_GREEN;
                        break;
                    case 6:
                        d = EGA_RED;
                        break;
                    case 7:
                        d = EGA_BLACK;
                        break;
                }
                setpalette(c, d);        // update pc palette
            }
            else {
                switch ((vidpal[c] & 7) ^ 7) {
                    case 0:
                        d = EGA_BLACK;
                        break;
                    case 1:
                        d = EGA_RED;
                        break;
                    case 2:
                        d = EGA_GREEN;
                        break;
                    case 3:
                        d = EGA_YELLOW;
                        break;
                    case 4:
                        d = EGA_BLUE;
                        break;
                    case 5:
                        d = EGA_MAGENTA;
                        break;
                    case 6:
                        d = EGA_CYAN;
                        break;
                    case 7:
                        d = EGA_WHITE;
                        break;
                }
                setpalette(c, d);        // update pc palette
            }

        }
}